

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NscParserRoutines.cpp
# Opt level: O1

CNscPStackEntry *
NscBuildVectorConstant(CNscPStackEntry *px,CNscPStackEntry *py,CNscPStackEntry *pz)

{
  CNwnDoubleLinkList *pCVar1;
  CNscPStackEntry *pCVar2;
  CNscContext *pCVar3;
  CNscPStackEntry *this;
  CNwnDoubleLinkList *pCVar4;
  float x;
  float y;
  float z;
  
  this = CNscContext::GetPStackEntryInt(g_pCtx);
  x = 0.0;
  if (px != (CNscPStackEntry *)0x0) {
    x = CNscPStackEntry::GetFloat(px);
    pCVar3 = g_pCtx;
    pCVar1 = (g_pCtx->m_listEntryFree).m_pPrev;
    pCVar2 = (CNscPStackEntry *)(px->m_link).m_pNext;
    if (pCVar2 != px) {
      pCVar4 = (px->m_link).m_pPrev;
      (pCVar2->m_link).m_pPrev = pCVar4;
      pCVar4->m_pNext = (CNwnDoubleLinkList *)pCVar2;
      (px->m_link).m_pNext = &px->m_link;
      (px->m_link).m_pPrev = &px->m_link;
    }
    pCVar4 = &pCVar3->m_listEntryFree;
    if ((CNscPStackEntry *)&pCVar3->m_listEntryFree == px) {
      pCVar4 = pCVar1;
    }
    pCVar1 = pCVar4->m_pNext;
    (px->m_link).m_pNext = pCVar1;
    (px->m_link).m_pPrev = pCVar4;
    pCVar4->m_pNext = &px->m_link;
    pCVar1->m_pPrev = &px->m_link;
  }
  y = 0.0;
  if (py != (CNscPStackEntry *)0x0) {
    y = CNscPStackEntry::GetFloat(py);
    pCVar3 = g_pCtx;
    pCVar1 = (g_pCtx->m_listEntryFree).m_pPrev;
    pCVar2 = (CNscPStackEntry *)(py->m_link).m_pNext;
    if (pCVar2 != py) {
      pCVar4 = (py->m_link).m_pPrev;
      (pCVar2->m_link).m_pPrev = pCVar4;
      pCVar4->m_pNext = (CNwnDoubleLinkList *)pCVar2;
      (py->m_link).m_pNext = &py->m_link;
      (py->m_link).m_pPrev = &py->m_link;
    }
    pCVar4 = &pCVar3->m_listEntryFree;
    if ((CNscPStackEntry *)&pCVar3->m_listEntryFree == py) {
      pCVar4 = pCVar1;
    }
    pCVar1 = pCVar4->m_pNext;
    (py->m_link).m_pNext = pCVar1;
    (py->m_link).m_pPrev = pCVar4;
    pCVar4->m_pNext = &py->m_link;
    pCVar1->m_pPrev = &py->m_link;
  }
  if (pz == (CNscPStackEntry *)0x0) {
    z = 0.0;
  }
  else {
    z = CNscPStackEntry::GetFloat(pz);
    pCVar3 = g_pCtx;
    pCVar1 = (g_pCtx->m_listEntryFree).m_pPrev;
    pCVar2 = (CNscPStackEntry *)(pz->m_link).m_pNext;
    if (pCVar2 != pz) {
      pCVar4 = (pz->m_link).m_pPrev;
      (pCVar2->m_link).m_pPrev = pCVar4;
      pCVar4->m_pNext = (CNwnDoubleLinkList *)pCVar2;
      (pz->m_link).m_pNext = &pz->m_link;
      (pz->m_link).m_pPrev = &pz->m_link;
    }
    pCVar4 = &pCVar3->m_listEntryFree;
    if ((CNscPStackEntry *)&pCVar3->m_listEntryFree == pz) {
      pCVar4 = pCVar1;
    }
    pCVar1 = pCVar4->m_pNext;
    (pz->m_link).m_pNext = pCVar1;
    (pz->m_link).m_pPrev = pCVar4;
    pCVar4->m_pNext = &pz->m_link;
    pCVar1->m_pPrev = &pz->m_link;
  }
  CNscPStackEntry::PushConstantVector(this,x,y,z);
  if (this->m_nType == NscType_Unknown) {
    this->m_nType = NscType_Vector;
    return this;
  }
  __assert_fail("m_nType == NscType_Unknown",
                "/workspace/llm4binary/github/license_c_cmakelists/nwneetools[P]nwnsc/_NscLib/NscPStackEntry.h"
                ,0xee,"void CNscPStackEntry::SetType(NscType)");
}

Assistant:

YYSTYPE NscBuildVectorConstant (YYSTYPE px, YYSTYPE py, YYSTYPE pz)
{
	CNscPStackEntry *pOut = g_pCtx ->GetPStackEntry (__FILE__, __LINE__);

	//
	// Get the x value
	//

	float x;
	if (px)
	{
		x = px ->GetFloat ();
		g_pCtx ->FreePStackEntry (px);
	}
	else
		x = 0;

	//
	// Get the y value
	//

	float y;
	if (py)
	{
		y = py ->GetFloat ();
		g_pCtx ->FreePStackEntry (py);
	}
	else
		y = 0;

	//
	// Get the z value
	//

	float z;
	if (pz)
	{
		z = pz ->GetFloat ();
		g_pCtx ->FreePStackEntry (pz);
	}
	else
		z = 0;

	//
	// Set the new value
	//

	pOut ->PushConstantVector (x, y, z);
	pOut ->SetType (NscType_Vector);
	return pOut;
}